

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O3

int xmlValidBuildAContentModel(xmlElementContentPtr content,xmlValidCtxtPtr ctxt,xmlChar *name)

{
  xmlElementContentOccur xVar1;
  int iVar2;
  xmlAutomataStatePtr pxVar3;
  xmlChar *token;
  char *msg;
  xmlAutomataStatePtr pxVar4;
  xmlAutomataStatePtr to;
  xmlAutomataPtr am;
  xmlChar fn [50];
  xmlChar local_68 [56];
  
  if (content == (xmlElementContentPtr)0x0) {
    msg = "Found NULL content in content model of %s\n";
    goto LAB_00153d64;
  }
  switch(content->type) {
  case XML_ELEMENT_CONTENT_PCDATA:
    msg = "Found PCDATA in content model of %s\n";
    goto LAB_00153d64;
  case XML_ELEMENT_CONTENT_ELEMENT:
    pxVar3 = ctxt->state;
    token = xmlBuildQName(content->name,content->prefix,local_68,0x32);
    if (token == (xmlChar *)0x0) {
      xmlVErrMemory(ctxt);
      return 0;
    }
    break;
  case XML_ELEMENT_CONTENT_SEQ:
    pxVar3 = ctxt->state;
    xVar1 = content->ocur;
    if (xVar1 != XML_ELEMENT_CONTENT_ONCE) {
      pxVar3 = xmlAutomataNewEpsilon(ctxt->am,pxVar3,(xmlAutomataStatePtr)0x0);
      ctxt->state = pxVar3;
    }
    do {
      iVar2 = xmlValidBuildAContentModel(content->c1,ctxt,name);
      if (iVar2 == 0) {
        return 0;
      }
      content = content->c2;
    } while ((content->type == XML_ELEMENT_CONTENT_SEQ) &&
            (content->ocur == XML_ELEMENT_CONTENT_ONCE));
    iVar2 = xmlValidBuildAContentModel(content,ctxt,name);
    if (iVar2 == 0) {
      return 0;
    }
    pxVar4 = ctxt->state;
    to = xmlAutomataNewEpsilon(ctxt->am,pxVar4,(xmlAutomataStatePtr)0x0);
    ctxt->state = to;
    if (xVar1 != XML_ELEMENT_CONTENT_PLUS) {
      if (xVar1 != XML_ELEMENT_CONTENT_MULT) {
joined_r0x00153e4d:
        pxVar4 = pxVar3;
        pxVar3 = to;
        if (xVar1 != XML_ELEMENT_CONTENT_OPT) {
          return 1;
        }
        am = ctxt->am;
        goto LAB_00153f2e;
      }
      xmlAutomataNewEpsilon(ctxt->am,pxVar3,to);
    }
    am = ctxt->am;
    goto LAB_00153f2e;
  case XML_ELEMENT_CONTENT_OR:
    xVar1 = content->ocur;
    if (xVar1 - XML_ELEMENT_CONTENT_MULT < 2) {
      pxVar3 = xmlAutomataNewEpsilon(ctxt->am,ctxt->state,(xmlAutomataStatePtr)0x0);
      ctxt->state = pxVar3;
    }
    else {
      pxVar3 = ctxt->state;
    }
    pxVar4 = xmlAutomataNewState(ctxt->am);
    do {
      ctxt->state = pxVar3;
      iVar2 = xmlValidBuildAContentModel(content->c1,ctxt,name);
      if (iVar2 == 0) {
        return 0;
      }
      xmlAutomataNewEpsilon(ctxt->am,ctxt->state,pxVar4);
      content = content->c2;
    } while ((content->type == XML_ELEMENT_CONTENT_OR) &&
            (content->ocur == XML_ELEMENT_CONTENT_ONCE));
    ctxt->state = pxVar3;
    iVar2 = xmlValidBuildAContentModel(content,ctxt,name);
    if (iVar2 == 0) {
      return 0;
    }
    xmlAutomataNewEpsilon(ctxt->am,ctxt->state,pxVar4);
    to = xmlAutomataNewEpsilon(ctxt->am,pxVar4,(xmlAutomataStatePtr)0x0);
    ctxt->state = to;
    if (xVar1 != XML_ELEMENT_CONTENT_PLUS) {
      if (xVar1 != XML_ELEMENT_CONTENT_MULT) goto joined_r0x00153e4d;
      xmlAutomataNewEpsilon(ctxt->am,pxVar3,to);
    }
    am = ctxt->am;
LAB_00153f2e:
    xmlAutomataNewEpsilon(am,pxVar4,pxVar3);
    return 1;
  default:
    msg = "ContentModel broken for element %s\n";
LAB_00153d64:
    xmlDoErrValid(ctxt,(xmlNodePtr)0x0,XML_ERR_INTERNAL_ERROR,2,name,(xmlChar *)0x0,(xmlChar *)0x0,0
                  ,msg,name);
    return 0;
  }
  switch(content->ocur) {
  case XML_ELEMENT_CONTENT_ONCE:
    pxVar3 = xmlAutomataNewTransition
                       (ctxt->am,ctxt->state,(xmlAutomataStatePtr)0x0,token,(void *)0x0);
    ctxt->state = pxVar3;
    break;
  case XML_ELEMENT_CONTENT_OPT:
    pxVar4 = xmlAutomataNewTransition
                       (ctxt->am,ctxt->state,(xmlAutomataStatePtr)0x0,token,(void *)0x0);
    ctxt->state = pxVar4;
    xmlAutomataNewEpsilon(ctxt->am,pxVar3,pxVar4);
    break;
  case XML_ELEMENT_CONTENT_MULT:
    pxVar3 = xmlAutomataNewEpsilon(ctxt->am,ctxt->state,(xmlAutomataStatePtr)0x0);
    goto LAB_00153e98;
  case XML_ELEMENT_CONTENT_PLUS:
    pxVar3 = xmlAutomataNewTransition
                       (ctxt->am,ctxt->state,(xmlAutomataStatePtr)0x0,token,(void *)0x0);
LAB_00153e98:
    ctxt->state = pxVar3;
    xmlAutomataNewTransition(ctxt->am,pxVar3,pxVar3,token,(void *)0x0);
  }
  if ((token != local_68) && (token != content->name)) {
    (*xmlFree)(token);
  }
  return 1;
}

Assistant:

static int
xmlValidBuildAContentModel(xmlElementContentPtr content,
		           xmlValidCtxtPtr ctxt,
		           const xmlChar *name) {
    if (content == NULL) {
	xmlErrValidNode(ctxt, NULL, XML_ERR_INTERNAL_ERROR,
			"Found NULL content in content model of %s\n",
			name, NULL, NULL);
	return(0);
    }
    switch (content->type) {
	case XML_ELEMENT_CONTENT_PCDATA:
	    xmlErrValidNode(ctxt, NULL, XML_ERR_INTERNAL_ERROR,
			    "Found PCDATA in content model of %s\n",
		            name, NULL, NULL);
	    return(0);
	    break;
	case XML_ELEMENT_CONTENT_ELEMENT: {
	    xmlAutomataStatePtr oldstate = ctxt->state;
	    xmlChar fn[50];
	    xmlChar *fullname;

	    fullname = xmlBuildQName(content->name, content->prefix, fn, 50);
	    if (fullname == NULL) {
	        xmlVErrMemory(ctxt);
		return(0);
	    }

	    switch (content->ocur) {
		case XML_ELEMENT_CONTENT_ONCE:
		    ctxt->state = xmlAutomataNewTransition(ctxt->am,
			    ctxt->state, NULL, fullname, NULL);
		    break;
		case XML_ELEMENT_CONTENT_OPT:
		    ctxt->state = xmlAutomataNewTransition(ctxt->am,
			    ctxt->state, NULL, fullname, NULL);
		    xmlAutomataNewEpsilon(ctxt->am, oldstate, ctxt->state);
		    break;
		case XML_ELEMENT_CONTENT_PLUS:
		    ctxt->state = xmlAutomataNewTransition(ctxt->am,
			    ctxt->state, NULL, fullname, NULL);
		    xmlAutomataNewTransition(ctxt->am, ctxt->state,
			                     ctxt->state, fullname, NULL);
		    break;
		case XML_ELEMENT_CONTENT_MULT:
		    ctxt->state = xmlAutomataNewEpsilon(ctxt->am,
					    ctxt->state, NULL);
		    xmlAutomataNewTransition(ctxt->am,
			    ctxt->state, ctxt->state, fullname, NULL);
		    break;
	    }
	    if ((fullname != fn) && (fullname != content->name))
		xmlFree(fullname);
	    break;
	}
	case XML_ELEMENT_CONTENT_SEQ: {
	    xmlAutomataStatePtr oldstate, oldend;
	    xmlElementContentOccur ocur;

	    /*
	     * Simply iterate over the content
	     */
	    oldstate = ctxt->state;
	    ocur = content->ocur;
	    if (ocur != XML_ELEMENT_CONTENT_ONCE) {
		ctxt->state = xmlAutomataNewEpsilon(ctxt->am, oldstate, NULL);
		oldstate = ctxt->state;
	    }
	    do {
		if (xmlValidBuildAContentModel(content->c1, ctxt, name) == 0)
                    return(0);
		content = content->c2;
	    } while ((content->type == XML_ELEMENT_CONTENT_SEQ) &&
		     (content->ocur == XML_ELEMENT_CONTENT_ONCE));
	    if (xmlValidBuildAContentModel(content, ctxt, name) == 0)
                return(0);
	    oldend = ctxt->state;
	    ctxt->state = xmlAutomataNewEpsilon(ctxt->am, oldend, NULL);
	    switch (ocur) {
		case XML_ELEMENT_CONTENT_ONCE:
		    break;
		case XML_ELEMENT_CONTENT_OPT:
		    xmlAutomataNewEpsilon(ctxt->am, oldstate, ctxt->state);
		    break;
		case XML_ELEMENT_CONTENT_MULT:
		    xmlAutomataNewEpsilon(ctxt->am, oldstate, ctxt->state);
		    xmlAutomataNewEpsilon(ctxt->am, oldend, oldstate);
		    break;
		case XML_ELEMENT_CONTENT_PLUS:
		    xmlAutomataNewEpsilon(ctxt->am, oldend, oldstate);
		    break;
	    }
	    break;
	}
	case XML_ELEMENT_CONTENT_OR: {
	    xmlAutomataStatePtr oldstate, oldend;
	    xmlElementContentOccur ocur;

	    ocur = content->ocur;
	    if ((ocur == XML_ELEMENT_CONTENT_PLUS) ||
		(ocur == XML_ELEMENT_CONTENT_MULT)) {
		ctxt->state = xmlAutomataNewEpsilon(ctxt->am,
			ctxt->state, NULL);
	    }
	    oldstate = ctxt->state;
	    oldend = xmlAutomataNewState(ctxt->am);

	    /*
	     * iterate over the subtypes and remerge the end with an
	     * epsilon transition
	     */
	    do {
		ctxt->state = oldstate;
		if (xmlValidBuildAContentModel(content->c1, ctxt, name) == 0)
                    return(0);
		xmlAutomataNewEpsilon(ctxt->am, ctxt->state, oldend);
		content = content->c2;
	    } while ((content->type == XML_ELEMENT_CONTENT_OR) &&
		     (content->ocur == XML_ELEMENT_CONTENT_ONCE));
	    ctxt->state = oldstate;
	    if (xmlValidBuildAContentModel(content, ctxt, name) == 0)
                return(0);
	    xmlAutomataNewEpsilon(ctxt->am, ctxt->state, oldend);
	    ctxt->state = xmlAutomataNewEpsilon(ctxt->am, oldend, NULL);
	    switch (ocur) {
		case XML_ELEMENT_CONTENT_ONCE:
		    break;
		case XML_ELEMENT_CONTENT_OPT:
		    xmlAutomataNewEpsilon(ctxt->am, oldstate, ctxt->state);
		    break;
		case XML_ELEMENT_CONTENT_MULT:
		    xmlAutomataNewEpsilon(ctxt->am, oldstate, ctxt->state);
		    xmlAutomataNewEpsilon(ctxt->am, oldend, oldstate);
		    break;
		case XML_ELEMENT_CONTENT_PLUS:
		    xmlAutomataNewEpsilon(ctxt->am, oldend, oldstate);
		    break;
	    }
	    break;
	}
	default:
	    xmlErrValid(ctxt, XML_ERR_INTERNAL_ERROR,
	                "ContentModel broken for element %s\n",
			(const char *) name);
	    return(0);
    }
    return(1);
}